

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

iter_type __thiscall
booster::locale::impl_posix::num_format<char>::do_format_currency
          (num_format<char> *this,bool intl,iter_type out,ios_base *param_3,char_type param_4,
          longdouble val)

{
  value_type *__val;
  int *piVar1;
  size_t sVar2;
  streambuf_type *psVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  char *__format;
  ostreambuf_iterator<char,_std::char_traits<char>_> out_00;
  ostreambuf_iterator<char,_std::char_traits<char>_> oVar5;
  iter_type iVar6;
  vector<char,_std::allocator<char>_> tmp;
  char local_6c [4];
  longdouble local_68;
  vector<char,_std::allocator<char>_> local_58;
  double local_38;
  
  psVar3 = out._M_sbuf;
  uVar4 = out._8_4_;
  local_68 = val;
  local_6c[0] = '\0';
  local_6c[1] = '\0';
  local_6c[2] = '\0';
  local_6c[3] = '\0';
  __format = "%n";
  if ((int)CONCAT71(in_register_00000031,intl) != 0) {
    __format = "%i";
  }
  piVar1 = __errno_location();
  *piVar1 = 0;
  local_38 = (double)local_68;
  local_68 = (longdouble)CONCAT28(local_68._8_2_,local_38);
  sVar2 = strfmon_l(local_6c,4,
                    (__locale_t)
                    *(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,__format);
  if ((long)sVar2 < 0) {
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(8);
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start + 8;
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[0] = '\0';
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = '\0';
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = '\0';
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[3] = '\0';
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[4] = '\0';
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[5] = '\0';
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[6] = '\0';
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[7] = '\0';
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    while( true ) {
      if (0x1002 < (ulong)((long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start)) break;
      sVar2 = strfmon_l(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                        (__locale_t)
                        *(this->lc_).
                         super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        __format,SUB104(local_68,0));
      if (-1 < (long)sVar2) {
        oVar5._8_4_ = uVar4 & 0xff;
        oVar5._M_sbuf = psVar3;
        oVar5._12_4_ = 0;
        oVar5 = write_it(this,oVar5,
                         local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,sVar2);
        psVar3 = oVar5._M_sbuf;
        uVar4 = oVar5._8_4_;
        break;
      }
      std::vector<char,_std::allocator<char>_>::resize
                (&local_58,
                 ((long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) * 2);
    }
    if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    out_00._8_4_ = uVar4 & 0xff;
    out_00._M_sbuf = psVar3;
    out_00._12_4_ = 0;
    oVar5 = write_it(this,out_00,local_6c,sVar2);
    psVar3 = oVar5._M_sbuf;
    uVar4 = oVar5._8_4_;
  }
  iVar6._8_4_ = uVar4;
  iVar6._M_sbuf = psVar3;
  iVar6._12_4_ = 0;
  return iVar6;
}

Assistant:

virtual iter_type do_format_currency(bool intl,iter_type out,std::ios_base &/*ios*/,char_type /*fill*/,long double val) const
    {
        char buf[4]={};
        char const *format = intl ? "%i" : "%n";
        errno=0;
        ssize_t n = strfmon_l(buf,sizeof(buf),*lc_,format,static_cast<double>(val));
        if(n >= 0) 
            return write_it(out,buf,n);
        
        for(std::vector<char> tmp(sizeof(buf)*2);tmp.size() <= 4098;tmp.resize(tmp.size()*2)) {
            n = strfmon_l(&tmp.front(),tmp.size(),*lc_,format,static_cast<double>(val));
            if(n >= 0)
                return write_it(out,&tmp.front(),n);
        }
        return out;
    }